

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O0

QStyleOptionSizeGrip * qstyleoption_cast<QStyleOptionSizeGrip_const*>(QStyleOption *opt)

{
  QStyleOption *opt_local;
  QStyleOptionSizeGrip *local_8;
  
  if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
     (local_8 = (QStyleOptionSizeGrip *)opt, opt->type != 0xf0007)) {
    local_8 = (QStyleOptionSizeGrip *)0x0;
  }
  return local_8;
}

Assistant:

T qstyleoption_cast(const QStyleOption *opt)
{
    typedef typename std::remove_cv<typename std::remove_pointer<T>::type>::type Opt;
    if (opt && opt->version >= Opt::Version && (opt->type == Opt::Type
        || int(Opt::Type) == QStyleOption::SO_Default
        || (int(Opt::Type) == QStyleOption::SO_Complex
            && opt->type > QStyleOption::SO_Complex)))
        return static_cast<T>(opt);
    return nullptr;
}